

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  JavaType JVar5;
  FileDescriptor *descriptor;
  MessageOptions *this_00;
  size_type sVar6;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *this_01;
  reference ppOVar7;
  OneofGeneratorInfo *args_1;
  FieldDescriptor *pFVar8;
  ImmutableFieldLiteGenerator *pIVar9;
  FieldDescriptor **__p;
  type ppFVar10;
  Descriptor *type;
  size_type sVar11;
  reference pvVar12;
  ulong uVar13;
  ulong extraout_RDX;
  ulong uStack_118;
  uint16_t code;
  size_t i_5;
  string line;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_e0;
  int i_4;
  int local_d4;
  undefined1 local_d0 [4];
  int i_3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields_for_is_initialized_check;
  FieldDescriptor *field;
  int i_2;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  int repeated_count;
  int map_count;
  uint local_78;
  int local_74;
  int i_1;
  int total_ints;
  int i;
  int total_bits;
  OneofDescriptor *oneof;
  iterator __end4;
  iterator __begin4;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range4;
  uint local_34;
  undefined1 local_30 [4];
  int flags;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  io::Printer::Indent(printer);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  descriptor = Descriptor::file((this->super_MessageGenerator).descriptor_);
  bVar2 = IsProto2(descriptor);
  local_34 = (uint)bVar2;
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  if (bVar2) {
    local_34 = local_34 | 2;
  }
  WriteIntToUtf16CharSequence
            (local_34,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
  WriteIntToUtf16CharSequence
            (iVar3,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
  if (iVar3 == 0) {
    io::Printer::Print<>
              ((Printer *)
               chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>
              ((Printer *)
               chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               "java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent((Printer *)
                        chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar6 = std::
            set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
            ::size(&(this->super_MessageGenerator).oneofs_);
    WriteIntToUtf16CharSequence
              ((int)sVar6,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    this_01 = &(this->super_MessageGenerator).oneofs_;
    __end4 = std::
             set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
             ::begin(this_01);
    oneof = (OneofDescriptor *)
            std::
            set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
            ::end(this_01);
    while (bVar2 = std::operator!=(&__end4,(_Self *)&oneof), bVar2) {
      ppOVar7 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                          (&__end4);
      puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      _i = *ppOVar7;
      args_1 = Context::GetOneofGeneratorInfo(this->context_,_i);
      io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)puVar1,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",
                 (char (*) [11])0x784886,&args_1->name);
      std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end4);
    }
    total_ints = 0;
    for (i_1 = 0; iVar3 = i_1,
        iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar3 < iVar4;
        i_1 = i_1 + 1) {
      pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_1);
      pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,pFVar8);
      iVar3 = (*pIVar9->_vptr_ImmutableFieldLiteGenerator[2])();
      total_ints = iVar3 + total_ints;
    }
    local_74 = (total_ints + 0x1f) / 0x20;
    uVar13 = (long)(total_ints + 0x1f) % 0x20 & 0xffffffff;
    for (local_78 = 0;
        puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, (int)local_78 < local_74;
        local_78 = local_78 + 1) {
      GetBitFieldName_abi_cxx11_((string *)&repeated_count,(java *)(ulong)local_78,(int)uVar13);
      io::Printer::Print<char[15],std::__cxx11::string>
                ((Printer *)puVar1,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &repeated_count);
      std::__cxx11::string::~string((string *)&repeated_count);
      uVar13 = extraout_RDX;
    }
    WriteIntToUtf16CharSequence
              (local_74,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._4_4_ = 0
    ;
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._0_4_ = 0
    ;
    __p = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    std::
    unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
    ::
    unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
              ((unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
                *)&stack0xffffffffffffff58,__p);
    for (field._4_4_ = 0;
        iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
        field._4_4_ < iVar3; field._4_4_ = field._4_4_ + 1) {
      ppFVar10 = std::
                 unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                               *)&stack0xffffffffffffff58,(long)field._4_4_);
      fields_for_is_initialized_check.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppFVar10;
      bVar2 = FieldDescriptor::is_map
                        ((FieldDescriptor *)
                         fields_for_is_initialized_check.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        sorted_fields._M_t.
        super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._4_4_
             = sorted_fields._M_t.
               super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
               _M_head_impl._4_4_ + 1;
      }
      else {
        bVar2 = FieldDescriptor::is_repeated
                          ((FieldDescriptor *)
                           fields_for_is_initialized_check.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          sorted_fields._M_t.
          super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
          .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl.
          _0_4_ = (int)sorted_fields._M_t.
                       super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                       .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                       _M_head_impl + 1;
        }
      }
    }
    ppFVar10 = std::
               unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                             *)&stack0xffffffffffffff58,0);
    iVar3 = FieldDescriptor::number(*ppFVar10);
    WriteIntToUtf16CharSequence
              (iVar3,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    ppFVar10 = std::
               unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                             *)&stack0xffffffffffffff58,(long)(iVar3 + -1));
    iVar3 = FieldDescriptor::number(*ppFVar10);
    WriteIntToUtf16CharSequence
              (iVar3,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    WriteIntToUtf16CharSequence
              (iVar3,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    WriteIntToUtf16CharSequence
              (sorted_fields._M_t.
               super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
               _M_head_impl._4_4_,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    WriteIntToUtf16CharSequence
              ((int)sorted_fields._M_t.
                    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                    _M_head_impl,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30
              );
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_d0);
    for (local_d4 = 0; iVar3 = local_d4,
        iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar3 < iVar4;
        local_d4 = local_d4 + 1) {
      pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_d4);
      bVar2 = FieldDescriptor::is_required(pFVar8);
      if (bVar2) {
LAB_00572bb3:
        pFStack_e0 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_d4);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_d0,&stack0xffffffffffffff20);
      }
      else {
        pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_d4);
        JVar5 = GetJavaType(pFVar8);
        if (JVar5 == JAVATYPE_MESSAGE) {
          pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_d4);
          type = FieldDescriptor::message_type(pFVar8);
          bVar2 = HasRequiredFields(type);
          if (bVar2) goto LAB_00572bb3;
        }
      }
    }
    sVar11 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_d0);
    WriteIntToUtf16CharSequence
              ((int)sVar11,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    for (field_1._4_4_ = 0;
        iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
        field_1._4_4_ < iVar3; field_1._4_4_ = field_1._4_4_ + 1) {
      ppFVar10 = std::
                 unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                               *)&stack0xffffffffffffff58,(long)field_1._4_4_);
      line.field_2._8_8_ = *ppFVar10;
      pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,(FieldDescriptor *)line.field_2._8_8_);
      (*pIVar9->_vptr_ImmutableFieldLiteGenerator[7])
                (pIVar9,chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_30);
    }
    io::Printer::Outdent
              ((Printer *)
               chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    io::Printer::Print<>
              ((Printer *)
               chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,"};\n");
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_d0);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                   *)&stack0xffffffffffffff58);
  }
  io::Printer::Print<>
            ((Printer *)
             chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,"java.lang.String info =\n");
  std::__cxx11::string::string((string *)&i_5);
  for (uStack_118 = 0;
      sVar11 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30),
      uStack_118 < sVar11; uStack_118 = uStack_118 + 1) {
    pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30,
                         uStack_118);
    EscapeUtf16ToString(*pvVar12,(string *)&i_5);
    uVar13 = std::__cxx11::string::size();
    if (0x4f < uVar13) {
      io::Printer::Print<char[7],std::__cxx11::string>
                ((Printer *)
                 chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,"    \"$string$\" +\n",
                 (char (*) [7])0x7c8c75,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
      std::__cxx11::string::clear();
    }
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            ((Printer *)
             chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,"    \"$string$\";\n",(char (*) [7])0x7c8c75,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
  io::Printer::Print<>
            ((Printer *)
             chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             "return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent
            ((Printer *)
             chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&i_5);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (IsProto2(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto oneof : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}